

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.hpp
# Opt level: O0

Result * CoreML::saveSpecification<CoreML::Specification::Model>
                   (Result *__return_storage_ptr__,Model *formatObj,ostream *out)

{
  bool bVar1;
  allocator local_99;
  string local_98;
  undefined1 local_68 [8];
  OstreamOutputStream rawOutput;
  ostream *out_local;
  Model *formatObj_local;
  
  rawOutput.impl_._40_8_ = out;
  google::protobuf::io::OstreamOutputStream::OstreamOutputStream
            ((OstreamOutputStream *)local_68,out,-1);
  bVar1 = google::protobuf::MessageLite::SerializeToZeroCopyStream
                    (&formatObj->super_MessageLite,(ZeroCopyOutputStream *)local_68);
  if (bVar1) {
    Result::Result(__return_storage_ptr__);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"unable to serialize object",&local_99);
    Result::Result(__return_storage_ptr__,FAILED_TO_SERIALIZE,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
  }
  google::protobuf::io::OstreamOutputStream::~OstreamOutputStream((OstreamOutputStream *)local_68);
  return __return_storage_ptr__;
}

Assistant:

static inline Result saveSpecification(const T& formatObj,
                                           std::ostream& out) {
        google::protobuf::io::OstreamOutputStream rawOutput(&out);

        if (!formatObj.SerializeToZeroCopyStream(&rawOutput)) {
            return Result(ResultType::FAILED_TO_SERIALIZE,
                          "unable to serialize object");
        }

        return Result();
    }